

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Vector3 * __thiscall
stateObservation::kine::Orientation::differentiate
          (Vector3 *__return_storage_ptr__,Orientation *this,Orientation *R_k1)

{
  char *__function;
  ActualDstType actualDst;
  AngleAxis aa;
  AngleAxis<double> local_1a8;
  undefined1 local_188 [64];
  undefined **local_148;
  IsSet local_140;
  AssertMsg local_138;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_128 [80];
  Orientation local_d8;
  
  if (((this->q_).isSet_.b_ == false) && ((this->m_).isSet_.b_ == false)) {
LAB_0011a824:
    __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
  }
  inverse(&local_d8,this);
  local_188._0_8_ = &PTR__CheckedItem_00125cd8;
  local_188[8] = true;
  local_188._16_8_ = detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
  local_148 = &PTR__CheckedItem_00125d08;
  local_140.b_ = true;
  local_138.b_ = detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
  setToProductNoAlias((Orientation *)local_188,R_k1,&local_d8);
  if (local_188[8] == false) {
    if (local_140.b_ == false) goto LAB_0011a824;
    if (local_138.b_ == (char *)0x0) {
      __function = 
      "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
      ;
      goto LAB_0011a86f;
    }
    Eigen::AngleAxis<double>::operator=(&local_1a8,local_128);
    local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_1a8.m_angle *
               local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         local_1a8.m_angle *
         local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] =
         local_1a8.m_angle *
         local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
  }
  else {
    if ((char *)local_188._16_8_ == (char *)0x0) {
      __function = 
      "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
      ;
LAB_0011a86f:
      __assert_fail("(isSet())&&(assertMsg_.get())",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x69,__function);
    }
    Eigen::AngleAxis<double>::operator=
              (&local_1a8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)(local_188 + 0x20));
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         local_1a8.m_angle *
         local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] =
         local_1a8.m_angle *
         local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_1a8.m_angle *
               local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] =
       local_1a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[2];
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Orientation::differentiate(Orientation R_k1) const
{
  check_();
  return (Orientation(R_k1, inverse())).toRotationVector();
}